

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O2

Object<cmCMakePresetsGraph::BuildPreset> * __thiscall
cmJSONHelperBuilder::Object<cmCMakePresetsGraph::BuildPreset>::
Bind<std::function<bool(cmCMakePresetsGraph::BuildPreset&,Json::Value_const*,cmJSONState*)>>
          (Object<cmCMakePresetsGraph::BuildPreset> *this,string_view *name,
          function<bool_(cmCMakePresetsGraph::BuildPreset_&,_const_Json::Value_*,_cmJSONState_*)>
          *func,bool required)

{
  Object<cmCMakePresetsGraph::BuildPreset> *pOVar1;
  function<bool_(cmCMakePresetsGraph::BuildPreset_&,_const_Json::Value_*,_cmJSONState_*)> local_40;
  
  std::function<bool_(cmCMakePresetsGraph::BuildPreset_&,_const_Json::Value_*,_cmJSONState_*)>::
  function(&local_40,func);
  pOVar1 = BindPrivate(this,name,&local_40,required);
  std::_Function_base::~_Function_base(&local_40.super__Function_base);
  return pOVar1;
}

Assistant:

Object& Bind(const cm::string_view& name, F func, bool required = true)
    {
      return this->BindPrivate(name, MemberFunction(func), required);
    }